

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

void duckdb::IntervalToStringCast::FormatIntervalValue
               (int32_t value,char *buffer,idx_t *length,char *name,idx_t name_len)

{
  idx_t iVar1;
  
  if (value != 0) {
    iVar1 = *length;
    if (iVar1 != 0) {
      *length = iVar1 + 1;
      buffer[iVar1] = ' ';
    }
    FormatSignedNumber((long)value,buffer,length);
    switchD_00917c1c::default(buffer + *length,name,name_len);
    iVar1 = name_len + *length;
    *length = iVar1;
    if ((value != -1) && (value != 1)) {
      *length = iVar1 + 1;
      buffer[iVar1] = 's';
    }
  }
  return;
}

Assistant:

static void FormatIntervalValue(int32_t value, char buffer[], idx_t &length, const char *name, idx_t name_len) {
		if (value == 0) {
			return;
		}
		if (length != 0) {
			// space if there is already something in the buffer
			buffer[length++] = ' ';
		}
		FormatSignedNumber(value, buffer, length);
		// append the name together with a potential "s" (for plurals)
		memcpy(buffer + length, name, name_len);
		length += name_len;
		if (value != 1 && value != -1) {
			buffer[length++] = 's';
		}
	}